

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  byte *pbVar1;
  byte bVar2;
  undefined8 uVar3;
  ushort uVar4;
  U32 length_1;
  ushort *puVar5;
  byte *pbVar6;
  U32 length_2;
  uint uVar7;
  ushort uVar8;
  int iVar9;
  ushort *puVar10;
  ulong uVar11;
  byte *pbVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  byte *pbVar16;
  byte *pbVar17;
  byte *pbVar18;
  U32 length;
  byte *pbVar19;
  BYTE *d_1;
  size_t __n;
  BYTE *s;
  BYTE *d;
  byte *pbVar20;
  byte *local_38;
  
  if (source == (char *)0x0) {
    source = (char *)0xffffffff;
  }
  else if (originalSize == 0) {
    source = (char *)(ulong)(-(uint)(*source != '\0') | 1);
  }
  else {
    pbVar1 = (byte *)(dest + originalSize);
    pbVar19 = (byte *)(dest + (long)originalSize + -8);
    pbVar16 = (byte *)(dest + (long)originalSize + -0x1a);
    iVar13 = (int)source;
    if (0x3f < originalSize) {
LAB_00113d9f:
      do {
        bVar2 = (byte)*(ushort *)source;
        uVar14 = (uint)bVar2;
        uVar7 = (uint)(bVar2 >> 4);
        if (uVar7 == 0xf) {
          uVar7 = 0;
          puVar5 = (ushort *)((long)source + 0x10);
          do {
            puVar10 = puVar5;
            uVar7 = uVar7 + *(byte *)((long)puVar10 + -0xf);
            puVar5 = (ushort *)((long)puVar10 + 1);
          } while (*(byte *)((long)puVar10 + -0xf) == 0xff);
          uVar11 = (ulong)uVar7;
          pbVar20 = (byte *)dest + uVar11 + 0xf;
          source = (char *)(puVar10 + -7);
          iVar9 = 6;
          if (pbVar20 <= pbVar19) {
            do {
              *(undefined8 *)dest = *(undefined8 *)source;
              dest = (char *)((byte *)dest + 8);
              source = (char *)((long)source + 8);
            } while (dest < pbVar20);
            source = (char *)((long)puVar10 + 1 + uVar11);
            iVar9 = 0;
            dest = (char *)pbVar20;
          }
          if (iVar9 != 0) goto LAB_00113fbc;
        }
        else {
          *(undefined8 *)dest = *(undefined8 *)((long)source + 1);
          if (0x8f < bVar2) {
            *(undefined8 *)((byte *)dest + 8) = *(undefined8 *)((long)source + 9);
          }
          source = (char *)((byte *)((long)source + 1) + uVar7);
          dest = (char *)((byte *)dest + uVar7);
        }
        pbVar20 = (byte *)dest;
        uVar8 = *(ushort *)source;
        uVar11 = (ulong)uVar8;
        source = (char *)((long)source + 2);
        pbVar17 = pbVar20 + -uVar11;
        uVar15 = (ulong)(bVar2 & 0xf);
        if (uVar15 == 0xf) {
          uVar7 = 0;
          do {
            uVar4 = *(ushort *)source;
            source = (char *)((long)source + 1);
            uVar7 = uVar7 + (byte)uVar4;
          } while ((byte)uVar4 == 0xff);
          uVar15 = (ulong)uVar7 + 0x13;
          if (pbVar1 + -0x40 <= pbVar20 + (ulong)uVar7 + 0x13) goto LAB_001140d1;
        }
        else {
          dest = (char *)(pbVar20 + uVar15 + 4);
          uVar15 = uVar15 + 4;
          if (pbVar1 + -0x40 <= dest) goto LAB_001140d1;
          if (7 < uVar8) {
            *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
            *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)(pbVar17 + 8);
            *(undefined2 *)(pbVar20 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
            goto LAB_00113d9f;
          }
        }
        dest = (char *)(pbVar20 + uVar15);
        if (uVar8 < 0x10) {
          if (uVar11 == 4) {
            iVar9 = *(int *)pbVar17;
          }
          else if (uVar8 == 2) {
            iVar9 = CONCAT22(*(undefined2 *)pbVar17,*(undefined2 *)pbVar17);
          }
          else {
            if (uVar8 != 1) {
              if (uVar8 < 8) {
                pbVar20[0] = 0;
                pbVar20[1] = 0;
                pbVar20[2] = 0;
                pbVar20[3] = 0;
                *pbVar20 = *pbVar17;
                pbVar20[1] = pbVar17[1];
                pbVar20[2] = pbVar17[2];
                pbVar20[3] = pbVar17[3];
                uVar7 = inc32table[uVar8];
                *(undefined4 *)(pbVar20 + 4) = *(undefined4 *)(pbVar17 + uVar7);
                pbVar17 = pbVar17 + ((ulong)uVar7 - (long)dec64table[uVar8]);
              }
              else {
                *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
                pbVar17 = pbVar17 + 8;
              }
              pbVar20 = pbVar20 + 8;
              do {
                *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
                pbVar20 = pbVar20 + 8;
                pbVar17 = pbVar17 + 8;
              } while (pbVar20 < dest);
              goto LAB_00113d9f;
            }
            iVar9 = (uint)*pbVar17 * 0x1010101;
          }
          *(int *)pbVar20 = iVar9;
          *(int *)(pbVar20 + 4) = iVar9;
          if (8 < uVar15) {
            pbVar20 = pbVar20 + 8;
            do {
              *(int *)pbVar20 = iVar9;
              *(int *)(pbVar20 + 4) = iVar9;
              pbVar20 = pbVar20 + 8;
            } while (pbVar20 < dest);
          }
          goto LAB_00113d9f;
        }
        do {
          uVar3 = *(undefined8 *)(pbVar20 + -uVar11 + 8);
          *(undefined8 *)pbVar20 = *(undefined8 *)(pbVar20 + -uVar11);
          *(undefined8 *)(pbVar20 + 8) = uVar3;
          uVar3 = *(undefined8 *)(pbVar20 + -uVar11 + 0x10 + 8);
          *(undefined8 *)(pbVar20 + 0x10) = *(undefined8 *)(pbVar20 + -uVar11 + 0x10);
          *(undefined8 *)(pbVar20 + 0x18) = uVar3;
          pbVar20 = pbVar20 + 0x20;
        } while (pbVar20 < dest);
      } while( true );
    }
LAB_00114123:
    do {
      bVar2 = (byte)*(ushort *)source;
      source = (char *)((long)source + 1);
      while( true ) {
        uVar14 = (uint)bVar2;
        __n = (size_t)(uint)(bVar2 >> 4);
        if ((0x8f < uVar14) || (pbVar16 < dest)) break;
        *(undefined8 *)dest = *(undefined8 *)source;
        pbVar20 = (byte *)dest + __n;
        uVar15 = (ulong)(uVar14 & 0xf);
        puVar5 = (ushort *)((long)source + __n);
        uVar8 = *puVar5;
        pbVar17 = pbVar20 + -(ulong)uVar8;
        if (((uVar14 & 0xf) == 0xf) || (uVar8 < 8)) goto LAB_001140ad;
        *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
        *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)(pbVar17 + 8);
        *(undefined2 *)(pbVar20 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
        dest = (char *)(pbVar20 + uVar15 + 4);
        bVar2 = *(byte *)((long)source + __n + 2);
        source = (char *)((long)source + __n + 3);
      }
      if (bVar2 >> 4 == 0xf) {
        uVar7 = 0;
        do {
          uVar8 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar7 = uVar7 + (byte)uVar8;
        } while ((byte)uVar8 == 0xff);
        __n = (ulong)uVar7 + 0xf;
      }
      pbVar20 = (byte *)dest + __n;
LAB_00114079:
      puVar5 = (ushort *)source;
      if (pbVar19 < pbVar20) {
        if (pbVar20 != pbVar1) goto LAB_0011413c;
        memmove(dest,source,__n);
        source = (char *)(ulong)(uint)(((int)source + (int)__n) - iVar13);
        goto LAB_0011415b;
      }
      do {
        *(undefined8 *)dest = *(undefined8 *)puVar5;
        dest = (char *)((byte *)dest + 8);
        puVar5 = puVar5 + 4;
      } while (dest < pbVar20);
      puVar5 = (ushort *)((long)source + __n);
      uVar8 = *puVar5;
      pbVar17 = pbVar20 + -(ulong)uVar8;
      uVar15 = (ulong)(uVar14 & 0xf);
LAB_001140ad:
      source = (char *)(puVar5 + 1);
      if ((int)uVar15 == 0xf) {
        uVar7 = 0;
        do {
          uVar4 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar7 = uVar7 + (byte)uVar4;
        } while ((byte)uVar4 == 0xff);
        uVar15 = (ulong)uVar7 + 0xf;
      }
      uVar15 = uVar15 + 4;
LAB_001140d1:
      dest = (char *)(pbVar20 + uVar15);
      if (uVar8 < 8) {
        LZ4_decompress_fast_cold_1();
        pbVar17 = local_38;
      }
      else {
        *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
        pbVar17 = pbVar17 + 8;
      }
      pbVar6 = pbVar20 + 8;
      if (dest <= pbVar1 + -0xc) {
        *(undefined8 *)pbVar6 = *(undefined8 *)pbVar17;
        if (0x10 < uVar15) {
          pbVar20 = pbVar20 + 0x10;
          do {
            pbVar17 = pbVar17 + 8;
            *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
            pbVar20 = pbVar20 + 8;
          } while (pbVar20 < dest);
        }
        goto LAB_00114123;
      }
      iVar9 = 5;
      if (dest <= pbVar1 + -5) {
        pbVar20 = pbVar1 + -7;
        pbVar12 = pbVar17;
        pbVar18 = pbVar6;
        if (pbVar6 < pbVar20) {
          do {
            *(undefined8 *)pbVar18 = *(undefined8 *)pbVar12;
            pbVar18 = pbVar18 + 8;
            pbVar12 = pbVar12 + 8;
          } while (pbVar18 < pbVar20);
          pbVar17 = pbVar17 + ((long)pbVar20 - (long)pbVar6);
          pbVar6 = pbVar20;
        }
        iVar9 = 0;
        for (; pbVar6 < dest; pbVar6 = pbVar6 + 1) {
          bVar2 = *pbVar17;
          pbVar17 = pbVar17 + 1;
          *pbVar6 = bVar2;
        }
      }
    } while (iVar9 == 0);
    if (iVar9 == 5) {
LAB_0011413c:
      source = (char *)(ulong)(~(uint)source + iVar13);
    }
  }
LAB_0011415b:
  return (int)source;
LAB_00113fbc:
  if (iVar9 == 6) {
    __n = uVar11 + 0xf;
    goto LAB_00114079;
  }
  goto LAB_0011415b;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}